

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O2

void __thiscall
sznet::net::TcpClient::TcpClient
          (TcpClient *this,EventLoop *loop,InetAddress *serverAddr,string *nameArg)

{
  element_type *peVar1;
  EventLoop *pEVar2;
  Connector *this_00;
  self *psVar3;
  EventLoop *in_R9;
  SourceFile file;
  SourceFile file_00;
  Logger local_1038;
  _Bind<void_(sznet::net::TcpClient::*(sznet::net::TcpClient_*,_std::_Placeholder<1>))(int)>
  local_68;
  SourceFile local_50;
  undefined1 local_40 [12];
  
  Logger::SourceFile::SourceFile<100>
            (&local_50,
             (char (*) [100])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
            );
  file.m_data = (char *)(ulong)(uint)local_50.m_size;
  file._8_8_ = 0x2c;
  pEVar2 = CheckNotNull<sznet::net::EventLoop>
                     ((sznet *)local_50.m_data,file,0x1339b4,(char *)loop,in_R9);
  this->m_loop = pEVar2;
  this_00 = (Connector *)operator_new(0x70);
  Connector::Connector(this_00,loop,serverAddr);
  std::__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sznet::net::Connector,void>
            ((__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2> *)&this->m_connector,
             this_00);
  std::__cxx11::string::string((string *)&this->m_name,(string *)nameArg);
  *(undefined8 *)((long)&(this->m_connectionCallback).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->m_connectionCallback).super__Function_base._M_functor =
       defaultConnectionCallback;
  (this->m_connectionCallback)._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&),_void_(*)(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
       ::_M_invoke;
  (this->m_connectionCallback).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&),_void_(*)(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->m_messageCallback).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->m_messageCallback).super__Function_base._M_functor = defaultMessageCallback;
  (this->m_messageCallback)._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp),_void_(*)(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
       ::_M_invoke;
  (this->m_messageCallback).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp),_void_(*)(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
       ::_M_manager;
  *(undefined8 *)&(this->m_writeCompleteCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_writeCompleteCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_writeCompleteCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_writeCompleteCallback)._M_invoker = (_Invoker_type)0x0;
  this->m_retry = false;
  this->m_connect = true;
  this->m_nextConnId = 1;
  MutexLock::MutexLock(&this->m_mutex);
  (this->m_connection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_connection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (this->m_connector).super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_68._M_f = (offset_in_TcpClient_to_subr)newConnection;
  local_68._8_8_ = 0;
  local_68._M_bound_args.super__Tuple_impl<0UL,_sznet::net::TcpClient_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_sznet::net::TcpClient_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sznet::net::TcpClient_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_sznet::net::TcpClient_*,_std::_Placeholder<1>_>)this;
  std::function<void(int)>::
  function<std::_Bind<void(sznet::net::TcpClient::*(sznet::net::TcpClient*,std::_Placeholder<1>))(int)>,void>
            ((function<void(int)> *)&local_1038,&local_68);
  std::function<void_(int)>::operator=
            (&peVar1->m_newConnectionCallback,(function<void_(int)> *)&local_1038);
  std::_Function_base::~_Function_base((_Function_base *)&local_1038);
  if (g_logLevel < 3) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_40,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_40._0_8_;
    file_00.m_size = local_40._8_4_;
    Logger::Logger(&local_1038,file_00,0x37);
    psVar3 = LogStream::operator<<(&local_1038.m_impl.m_stream,"TcpClient::TcpClient[");
    psVar3 = LogStream::operator<<(psVar3,&this->m_name);
    psVar3 = LogStream::operator<<(psVar3,"] - connector ");
    LogStream::operator<<
              (psVar3,(this->m_connector).
                      super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Logger::~Logger(&local_1038);
  }
  return;
}

Assistant:

TcpClient::TcpClient(EventLoop* loop, const InetAddress& serverAddr, const string& nameArg): 
	m_loop(CHECK_NOTNULL(loop)),
    m_connector(new Connector(loop, serverAddr)),
    m_name(nameArg),
    m_connectionCallback(defaultConnectionCallback),
    m_messageCallback(defaultMessageCallback),
    m_retry(false),
    m_connect(true),
    m_nextConnId(1)
{
	m_connector->setNewConnectionCallback(std::bind(&TcpClient::newConnection, this, std::placeholders::_1));
	// FIXME setConnectFailedCallback
	LOG_INFO << "TcpClient::TcpClient[" << m_name 
		<< "] - connector " << get_pointer(m_connector);
}